

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkAssignIDs2(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  int iVar9;
  
  Abc_NtkCleanCopy(pNtk);
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      *(int *)((long)pVVar5->pArray[lVar4] + 0x40) = (int)lVar4;
      lVar4 = lVar4 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  iVar9 = pNtk->nObjCounts[7];
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar9 - 1U) {
    iVar8 = iVar9;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar5->pArray = ppvVar6;
  pVVar7 = pNtk->vObjs;
  if (0 < pVVar7->nSize) {
    lVar4 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar4];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
        uVar1 = pVVar5->nSize;
        *(uint *)((long)pvVar3 + 0x40) = pNtk->vCis->nSize + uVar1;
        uVar2 = pVVar5->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
            }
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar2 * 2;
            if (iVar9 <= (int)uVar2) goto LAB_0027a0ce;
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar9;
        }
LAB_0027a0ce:
        pVVar5->nSize = uVar1 + 1;
        pVVar5->pArray[(int)uVar1] = pvVar3;
      }
      lVar4 = lVar4 + 1;
      pVVar7 = pNtk->vObjs;
    } while (lVar4 < pVVar7->nSize);
  }
  iVar9 = pVVar5->nSize;
  if (iVar9 != pNtk->nObjCounts[7]) {
    __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkNodeNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                  ,0x4d,"Vec_Ptr_t *Abc_NtkAssignIDs2(Abc_Ntk_t *)");
  }
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar4 = 0;
    do {
      *(int *)((long)pVVar7->pArray[lVar4] + 0x40) = iVar9 + (int)lVar4 + pNtk->vCis->nSize;
      lVar4 = lVar4 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar4 < pVVar7->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Abc_NtkAssignIDs2( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = i;
    vNodes = Vec_PtrAlloc( Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->iTemp = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes);
        Vec_PtrPush( vNodes, pObj );
    }
    assert( Vec_PtrSize(vNodes) == Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->iTemp = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + i;
    return vNodes;
}